

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,char *label,ImGuiID tab_id,
               ImGuiID close_button_id)

{
  bool bVar1;
  int iVar2;
  ImFont *in_RCX;
  uint in_EDX;
  ImRect *in_RSI;
  ImVec2 in_RDI;
  ImGuiID in_R8D;
  ImGuiID in_R9D;
  float fVar3;
  float fVar4;
  float ellipsis_x;
  float label_size_clipped_x;
  char *label_end;
  float ellipsis_width;
  int ellipsis_dot_count;
  char *label_display_end;
  float close_button_sz;
  ImGuiItemHoveredDataBackup last_item_backup;
  bool close_button_visible;
  bool close_button_pressed;
  ImRect text_ellipsis_clip_bb;
  ImVec2 unsaved_marker_pos;
  ImRect text_pixel_clip_bb;
  char *TAB_UNSAVED_MARKER;
  ImVec2 label_size;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffe48;
  ImGuiItemHoveredDataBackup *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 repeat;
  ImRect *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  ImDrawList *in_stack_fffffffffffffe78;
  char **in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  ImVec2 *in_stack_fffffffffffffea8;
  ImFont *text_size_if_known;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  ImFont *in_stack_fffffffffffffeb8;
  ImVec2 *in_stack_fffffffffffffec0;
  ImFont *pos_max;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  ImGuiID in_stack_fffffffffffffed4;
  ImVec2 *in_stack_fffffffffffffee0;
  ImVec2 in_stack_fffffffffffffee8;
  ImVec2 local_110;
  float local_108;
  ImVec2 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  ImVec2 local_ec;
  float local_e4;
  ImFont *local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  ImFont *local_d0;
  ImVec2 local_c8;
  float local_c0;
  ImGuiItemHoveredDataBackup local_bc;
  byte local_92;
  byte local_91;
  ImVec2 pos;
  float in_stack_ffffffffffffff80;
  ImVec2 local_70;
  ImVec2 local_68;
  float local_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  ImVec2 *local_50;
  ImVec2 local_48;
  ImGuiStyle *local_40;
  ImGuiContext *local_38;
  ImGuiID local_30;
  ImGuiID local_2c;
  ImFont *local_28;
  uint local_1c;
  ImRect *local_18;
  ImVec2 local_10;
  bool local_1;
  
  local_38 = GImGui;
  local_40 = &GImGui->Style;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_48 = CalcTextSize((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                          SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                          (float)in_stack_fffffffffffffe68);
  fVar3 = ImRect::GetWidth(local_18);
  if (1.0 < fVar3) {
    local_50 = (ImVec2 *)0x1e32d6;
    ImRect::ImRect(in_stack_fffffffffffffe60,(float)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (float)in_stack_fffffffffffffe58,
                   (float)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                   SUB84(in_stack_fffffffffffffe50,0));
    repeat = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
    if ((local_1c & 1) != 0) {
      local_68 = CalcTextSize((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                              SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                              (float)in_stack_fffffffffffffe68);
      local_58 = local_58 - local_68.x;
      fVar3 = ImMin<float>((local_18->Min).x + (local_40->FramePadding).x + local_48.x + 2.0,
                           local_58);
      ImVec2::ImVec2(&local_70,fVar3,
                     (local_18->Min).y + (local_40->FramePadding).y +
                     (float)(int)(local_38->FontSize * -0.25));
      operator-(in_stack_fffffffffffffe48,(ImVec2 *)0x17ba1c);
      in_stack_fffffffffffffee0 = local_50;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
      in_stack_fffffffffffffe48 = (ImVec2 *)&stack0xffffffffffffff80;
      in_stack_fffffffffffffe50 = (ImGuiItemHoveredDataBackup *)0x0;
      RenderTextClippedEx((ImDrawList *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                          (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
                          (ImRect *)in_stack_fffffffffffffee8);
    }
    pos.y = fStack_54;
    pos.x = local_58;
    local_91 = 0;
    local_92 = 0;
    if ((local_30 != 0) &&
       (((local_38->HoveredId == local_2c || (local_38->HoveredId == local_30)) ||
        (local_38->ActiveId == local_30)))) {
      local_92 = 1;
    }
    if (local_92 != 0) {
      fVar3 = fStack_5c;
      ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup(in_stack_fffffffffffffe50);
      local_c0 = local_38->FontSize * 0.5;
      ImVec2::ImVec2(&local_c8,((local_18->Max).x - (local_40->FramePadding).x) - local_c0,
                     (local_18->Min).y + (local_40->FramePadding).y + local_c0);
      bVar1 = CloseButton((ImGuiID)in_stack_ffffffffffffff80,(ImVec2 *)pos,fVar3);
      if (bVar1) {
        local_91 = 1;
      }
      ImGuiItemHoveredDataBackup::Restore(&local_bc);
      if (((local_1c & 4) == 0) &&
         (bVar1 = IsMouseClicked((int)in_stack_fffffffffffffe60,(bool)repeat), bVar1)) {
        local_91 = 1;
      }
      local_58 = -local_c0 + -local_c0 + local_58;
      in_stack_fffffffffffffed4 = local_30;
    }
    local_d0 = (ImFont *)FindRenderedTextEnd((char *)local_28,(char *)0x0);
    fVar3 = local_48.x;
    fVar4 = ImRect::GetWidth((ImRect *)&stack0xffffffffffffff70);
    if (fVar3 <= fVar4) {
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffee8,0.0,0.0);
      RenderTextClippedEx((ImDrawList *)CONCAT44(in_stack_fffffffffffffed4,fVar3),
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                          (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
                          (ImRect *)in_stack_fffffffffffffee8);
    }
    else {
      local_d4 = 3;
      local_d8 = 0x40a00000;
      local_e0 = (ImFont *)0x0;
      pos_max = local_38->Font;
      fVar4 = local_38->FontSize;
      ImRect::GetWidth((ImRect *)&stack0xffffffffffffff70);
      local_ec = ImFont::CalcTextSizeA
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                            in_stack_fffffffffffffeb0,
                            (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                            in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                            in_stack_fffffffffffffe90);
      local_e4 = local_ec.x;
      if ((local_e0 == local_28) && (local_e0 < local_d0)) {
        in_stack_fffffffffffffeb8 = local_28;
        iVar2 = ImTextCountUtf8BytesFromChar
                          ((char *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
        local_e0 = (ImFont *)((long)&in_stack_fffffffffffffeb8->FontSize + (long)iVar2);
        local_f4 = ImFont::CalcTextSizeA
                             (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                              in_stack_fffffffffffffeb0,
                              (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                              in_stack_fffffffffffffe90);
        local_e4 = local_f4.x;
      }
      while( true ) {
        in_stack_fffffffffffffeb4 = (float)((uint)in_stack_fffffffffffffeb4 & 0xffffff);
        if (local_28 < local_e0) {
          bVar1 = ImCharIsBlankA(*(char *)((long)&local_e0[-1].MetricsTotalSurface + 3));
          in_stack_fffffffffffffeb4 = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffeb4,0));
        }
        if ((char)((uint)in_stack_fffffffffffffeb4 >> 0x18) == '\0') break;
        local_e0 = (ImFont *)((long)&local_e0[-1].MetricsTotalSurface + 3);
        local_fc = ImFont::CalcTextSizeA
                             (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                              in_stack_fffffffffffffeb0,
                              (float)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                              in_stack_fffffffffffffe90);
        local_e4 = local_e4 - local_fc.x;
      }
      text_size_if_known = local_e0;
      ImVec2::ImVec2(&local_104,0.0,0.0);
      RenderTextClippedEx((ImDrawList *)CONCAT44(in_stack_fffffffffffffed4,fVar3),
                          (ImVec2 *)CONCAT44(fVar4,in_stack_fffffffffffffec8),(ImVec2 *)pos_max,
                          (char *)in_stack_fffffffffffffeb8,
                          (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (ImVec2 *)text_size_if_known,in_stack_fffffffffffffee0,
                          (ImRect *)in_stack_fffffffffffffee8);
      local_108 = local_60 + local_e4 + 1.0;
      if (((local_92 & 1) == 0) && (local_108 + 5.0 <= (local_18->Max).x)) {
        ImVec2::ImVec2(&local_110,local_108,fStack_5c);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                    SUB84(in_stack_fffffffffffffe60,0));
        RenderPixelEllipsis(in_stack_fffffffffffffe78,local_10,
                            (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            (ImU32)in_stack_fffffffffffffe70);
      }
    }
    local_1 = (bool)(local_91 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + style.FramePadding.x, bb.Min.y + style.FramePadding.y, bb.Max.x - style.FramePadding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + style.FramePadding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + style.FramePadding.y + (float)(int)(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - style.FramePadding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize * 0.5f;
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - style.FramePadding.x - close_button_sz, bb.Min.y + style.FramePadding.y + close_button_sz), close_button_sz))
            close_button_pressed = true;
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz * 2.0f;
    }

    // Label with ellipsis
    // FIXME: This should be extracted into a helper but the use of text_pixel_clip_bb and !close_button_visible makes it tricky to abstract at the moment
    const char* label_display_end = FindRenderedTextEnd(label);
    if (label_size.x > text_ellipsis_clip_bb.GetWidth())
    {
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* label_end = NULL;
        float label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, text_ellipsis_clip_bb.GetWidth() - ellipsis_width + 1.0f, 0.0f, label, label_display_end, &label_end).x;
        if (label_end == label && label_end < label_display_end)    // Always display at least 1 character if there's no room for character + ellipsis
        {
            label_end = label + ImTextCountUtf8BytesFromChar(label, label_display_end);
            label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label, label_end).x;
        }
        while (label_end > label && ImCharIsBlankA(label_end[-1])) // Trim trailing space
        {
            label_end--;
            label_size_clipped_x -= g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label_end, label_end + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_end, &label_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = text_pixel_clip_bb.Min.x + label_size_clipped_x + 1.0f;
        if (!close_button_visible && ellipsis_x + ellipsis_width <= bb.Max.x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, text_pixel_clip_bb.Min.y), ellipsis_dot_count, GetColorU32(ImGuiCol_Text));
    }
    else
    {
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_display_end, &label_size, ImVec2(0.0f, 0.0f));
    }

    return close_button_pressed;
}